

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexPlaneCollisionAlgorithm.cpp
# Opt level: O1

cbtScalar __thiscall
cbtConvexPlaneCollisionAlgorithm::calculateTimeOfImpact
          (cbtConvexPlaneCollisionAlgorithm *this,cbtCollisionObject *col0,cbtCollisionObject *col1,
          cbtDispatcherInfo *dispatchInfo,cbtManifoldResult *resultOut)

{
  return 1.0;
}

Assistant:

cbtScalar cbtConvexPlaneCollisionAlgorithm::calculateTimeOfImpact(cbtCollisionObject* col0, cbtCollisionObject* col1, const cbtDispatcherInfo& dispatchInfo, cbtManifoldResult* resultOut)
{
	(void)resultOut;
	(void)dispatchInfo;
	(void)col0;
	(void)col1;

	//not yet
	return cbtScalar(1.);
}